

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

void zdd_writer_writetext(FILE *out,sylvan_skiplist_t sl)

{
  uint32_t uVar1;
  int iVar2;
  size_t sVar3;
  MTBDD dd_00;
  zddnode_t n_00;
  uint64_t uVar4;
  char *pcVar5;
  uint64_t uVar6;
  ZDD local_48;
  ZDD high;
  ZDD low;
  zddnode_t n;
  ZDD dd;
  size_t i;
  size_t nodecount;
  sylvan_skiplist_t sl_local;
  FILE *out_local;
  
  fprintf((FILE *)out,"[\n");
  sVar3 = sylvan_skiplist_count(sl);
  for (dd = 1; dd <= sVar3; dd = dd + 1) {
    dd_00 = sylvan_skiplist_getr(sl,dd);
    n_00 = ZDD_GETNODE(dd_00);
    high = zddnode_getlow(n_00);
    local_48 = zddnode_gethigh(n_00);
    uVar4 = ZDD_GETINDEX(high);
    if (1 < uVar4) {
      uVar4 = ZDD_GETINDEX(high);
      uVar4 = sylvan_skiplist_get(sl,uVar4);
      high = ZDD_SETINDEX(high,uVar4);
    }
    uVar4 = ZDD_GETINDEX(local_48);
    if (1 < uVar4) {
      uVar4 = ZDD_GETINDEX(local_48);
      uVar4 = sylvan_skiplist_get(sl,uVar4);
      local_48 = ZDD_SETINDEX(local_48,uVar4);
    }
    uVar1 = zddnode_getvariable(n_00);
    uVar4 = ZDD_GETINDEX(high);
    iVar2 = ZDD_HASMARK(local_48);
    pcVar5 = "";
    if (iVar2 != 0) {
      pcVar5 = "~";
    }
    uVar6 = ZDD_GETINDEX(local_48);
    fprintf((FILE *)out,"  node(%zu,%u,low(%zu),%shigh(%zu)),\n",dd,(ulong)uVar1,uVar4,pcVar5,uVar6)
    ;
  }
  fprintf((FILE *)out,"]");
  return;
}

Assistant:

void
zdd_writer_writetext(FILE *out, sylvan_skiplist_t sl)
{
    fprintf(out, "[\n");
    size_t nodecount = sylvan_skiplist_count(sl);
    for (size_t i=1; i<=nodecount; i++) {
        ZDD dd = sylvan_skiplist_getr(sl, i);

        zddnode_t n = ZDD_GETNODE(dd);
        ZDD low = zddnode_getlow(n);
        ZDD high = zddnode_gethigh(n);
        if (ZDD_GETINDEX(low) > 1) low = ZDD_SETINDEX(low, sylvan_skiplist_get(sl, ZDD_GETINDEX(low)));
        if (ZDD_GETINDEX(high) > 1) high = ZDD_SETINDEX(high, sylvan_skiplist_get(sl, ZDD_GETINDEX(high)));
        fprintf(out, "  node(%zu,%u,low(%zu),%shigh(%zu)),\n", i, zddnode_getvariable(n), (size_t)ZDD_GETINDEX(low), ZDD_HASMARK(high)?"~":"", (size_t)ZDD_GETINDEX(high));
    }

    fprintf(out, "]");
}